

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Privkey * __thiscall cfd::core::Privkey::CreateNegate(Privkey *__return_storage_ptr__,Privkey *this)

{
  ByteData negated;
  
  WallyUtil::NegatePrivkey(&negated,&this->data_);
  Privkey(__return_storage_ptr__,&negated,kMainnet,true);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&negated);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::CreateNegate() const {
  ByteData negated = WallyUtil::NegatePrivkey(data_);
  return Privkey(negated);
}